

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_data.hpp
# Opt level: O2

SimpleBufferedData * __thiscall
duckdb::BufferedData::Cast<duckdb::SimpleBufferedData>(BufferedData *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == SIMPLE) {
    return (SimpleBufferedData *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to cast buffered data to type - buffered data type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != type) {
			throw InternalException("Failed to cast buffered data to type - buffered data type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}